

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O0

TonkResult tonk_inject(TonkSocket tonkSocket,uint16_t sourcePort,void *data,uint32_t bytes)

{
  int in_ECX;
  long in_RDX;
  short in_SI;
  long in_RDI;
  uint32_t unaff_retaddr;
  uint8_t *in_stack_00000008;
  uint16_t in_stack_00000016;
  ApplicationSession *in_stack_00000018;
  Result result;
  ApplicationSession *session;
  Result *result_00;
  Result local_38 [6];
  TonkResult local_4;
  
  if ((((in_RDI == 0) || (in_SI == 0)) || (in_RDX == 0)) || (in_ECX == 0)) {
    local_4 = Tonk_InvalidInput;
  }
  else {
    result_00 = local_38;
    tonk::ApplicationSession::tonk_inject
              (in_stack_00000018,in_stack_00000016,in_stack_00000008,unaff_retaddr);
    local_4 = TonkResultFromDetailedResult(result_00);
    tonk::Result::~Result(result_00);
  }
  return local_4;
}

Assistant:

TONK_EXPORT TonkResult tonk_inject(
    TonkSocket   tonkSocket, ///< [in] Socket to inject
    uint16_t     sourcePort, ///< [in] Source port of datagram
    const void*        data, ///< [in] Datagram data
    uint32_t          bytes  ///< [in] Datagram bytes
)
{
    auto session = reinterpret_cast<ApplicationSession*>(tonkSocket);
    if (!session || sourcePort == 0 || !data || bytes <= 0)
    {
        TONK_DEBUG_BREAK(); // Invalid input
        return Tonk_InvalidInput;
    }

    Result result = session->tonk_inject(
        sourcePort,
        reinterpret_cast<const uint8_t*>(data),
        bytes);
    return TonkResultFromDetailedResult(result);
}